

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lab5.cpp
# Opt level: O3

void parse(ifstream *in,people *man)

{
  char cVar1;
  uint uVar2;
  state sVar3;
  istream *piVar4;
  int iVar5;
  long *plVar6;
  long lVar7;
  int i;
  int iVar8;
  string str;
  char *local_d0;
  long local_c8;
  char local_c0;
  undefined7 uStack_bf;
  long *local_b0 [2];
  long local_a0 [2];
  long *local_90 [2];
  long local_80 [2];
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  local_d0 = &local_c0;
  local_c8 = 0;
  local_c0 = '\0';
  iVar8 = 0;
  do {
    piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)in,(string *)&local_d0,',');
    if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) == 0) {
      switch(iVar8) {
      case 0:
        if (local_c8 != 0) {
          local_50[0] = local_40;
          std::__cxx11::string::_M_construct<char*>((string *)local_50,local_d0,local_d0 + local_c8)
          ;
          uVar2 = (int)(char)*local_50[0] - 0x30;
          iVar5 = 0;
          if (uVar2 < 10) {
            iVar5 = 0;
            plVar6 = local_50[0];
            do {
              plVar6 = (long *)((long)plVar6 + 1);
              iVar5 = uVar2 + iVar5 * 10;
              uVar2 = (int)*(char *)plVar6 - 0x30;
            } while (uVar2 < 10);
          }
          man->id = iVar5;
          lVar7 = local_40[0];
          plVar6 = local_50[0];
          if (local_50[0] != local_40) {
LAB_0010259d:
            operator_delete(plVar6,lVar7 + 1);
          }
        }
        break;
      case 1:
        if (local_c8 != 0) {
          local_70[0] = local_60;
          std::__cxx11::string::_M_construct<char*>((string *)local_70,local_d0,local_d0 + local_c8)
          ;
          uVar2 = (int)(char)*local_70[0] - 0x30;
          iVar5 = 1;
          if (uVar2 < 10) {
            iVar5 = 0;
            plVar6 = local_70[0];
            do {
              plVar6 = (long *)((long)plVar6 + 1);
              iVar5 = uVar2 + iVar5 * 10;
              uVar2 = (int)*(char *)plVar6 - 0x30;
            } while (uVar2 < 10);
            iVar5 = iVar5 + 1;
          }
          man->surv = iVar5;
          lVar7 = local_60[0];
          plVar6 = local_70[0];
          if (local_70[0] != local_60) goto LAB_0010259d;
        }
        break;
      case 2:
        if (local_c8 != 0) {
          local_90[0] = local_80;
          std::__cxx11::string::_M_construct<char*>((string *)local_90,local_d0,local_d0 + local_c8)
          ;
          uVar2 = (int)(char)*local_90[0] - 0x30;
          iVar5 = 0;
          if (uVar2 < 10) {
            iVar5 = 0;
            plVar6 = local_90[0];
            do {
              plVar6 = (long *)((long)plVar6 + 1);
              iVar5 = uVar2 + iVar5 * 10;
              uVar2 = (int)*(char *)plVar6 - 0x30;
            } while (uVar2 < 10);
          }
          if (local_90[0] != local_80) {
            operator_delete(local_90[0],local_80[0] + 1);
          }
          if (iVar5 == 3) {
            man->people_pclass = THIRD;
          }
          else if (iVar5 == 2) {
            man->people_pclass = SECOND;
          }
          else if (iVar5 == 1) {
            man->people_pclass = FIRST;
          }
        }
        break;
      case 5:
        if (local_c8 != 0) {
          if (*local_d0 == 'f') {
            man->people_sex = FEMALE;
          }
          else if (*local_d0 == 'm') {
            man->people_sex = MALE;
          }
        }
        break;
      case 6:
        if (local_c8 != 0) {
          local_b0[0] = local_a0;
          std::__cxx11::string::_M_construct<char*>((string *)local_b0,local_d0,local_d0 + local_c8)
          ;
          uVar2 = (int)(char)*local_b0[0] - 0x30;
          iVar5 = 0;
          if (uVar2 < 10) {
            iVar5 = 0;
            plVar6 = local_b0[0];
            do {
              plVar6 = (long *)((long)plVar6 + 1);
              iVar5 = uVar2 + iVar5 * 10;
              uVar2 = (int)*(char *)plVar6 - 0x30;
            } while (uVar2 < 10);
          }
          man->age = iVar5;
          lVar7 = local_a0[0];
          plVar6 = local_b0[0];
          if (local_b0[0] != local_a0) goto LAB_0010259d;
        }
      }
    }
    iVar8 = iVar8 + 1;
  } while (iVar8 != 0xc);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)in,(string *)&local_d0,'\r');
  if (local_c8 != 0) {
    cVar1 = *local_d0;
    if (cVar1 == 'C') {
      sVar3 = CHERBOURG;
    }
    else if (cVar1 == 'Q') {
      sVar3 = QUEENSTOWN;
    }
    else {
      sVar3 = SOUTHAMPTON;
      if (cVar1 != 'S') goto LAB_00102617;
    }
    man->people_state = sVar3;
  }
LAB_00102617:
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,CONCAT71(uStack_bf,local_c0) + 1);
  }
  return;
}

Assistant:

void parse(std::ifstream* in, people* man){
    std::string str;
    for (int i = 0; i < 12; i ++){
        if (getline(*in, str, ','))
        switch (i) {
            case 0:
                if (str.length())
                man->id = to_int(str);
                break;
            case 1:
                if (str.length())
                man->surv = to_int(str) + 1;
                break;
            case 2:
                if (str.length())
                switch (to_int(str)){
                    case 1:
                        man->people_pclass = FIRST;
                        break;
                    case 2:
                        man->people_pclass = SECOND;
                        break;
                    case 3:
                        man->people_pclass = THIRD;
                        break;
                }
                break;
            case 5:
                if (str.length())
                switch (str[0]) {
                    case 'm':
                        man->people_sex = MALE;
                        break;
                    case 'f':
                        man->people_sex = FEMALE;
                        break;
                }
                break;
            case 6:
                if (str.length())
                man->age = to_int(str);
                break;
        }

    }
    getline(*in, str, '\r');
    if (str.length())
    switch (str[0]){
        case 'S':
            man->people_state = SOUTHAMPTON;
            break;
        case 'Q':
            man->people_state = QUEENSTOWN;
            break;
        case 'C':
            man->people_state = CHERBOURG;
            break;
    }
}